

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  undefined1 uVar1;
  byte bVar2;
  Message *this;
  char *pcVar3;
  Message *this_00;
  Int32 in_ESI;
  Int32 *in_stack_00000018;
  char *in_stack_00000020;
  Message *in_stack_00000028;
  Int32 result;
  char *string_value;
  String env_var;
  String *in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  Message *in_stack_ffffffffffffff70;
  String local_60;
  Int32 local_44;
  undefined4 local_40;
  char *in_stack_ffffffffffffffc8;
  String local_28;
  Int32 local_14;
  Int32 local_4;
  
  local_14 = in_ESI;
  FlagToEnvVar(in_stack_ffffffffffffffc8);
  this = (Message *)String::c_str(&local_28);
  pcVar3 = posix::GetEnv((char *)0x23d62b);
  if (pcVar3 == (char *)0x0) {
    local_4 = local_14;
  }
  else {
    local_44 = local_14;
    Message::Message(this);
    Message::operator<<(in_stack_ffffffffffffff70,
                        (char (*) [22])
                        CONCAT17(in_stack_ffffffffffffff6f,
                                 CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
    this_00 = Message::operator<<(in_stack_ffffffffffffff70,
                                  (String *)
                                  CONCAT17(in_stack_ffffffffffffff6f,
                                           CONCAT16(in_stack_ffffffffffffff6e,
                                                    in_stack_ffffffffffffff68)));
    uVar1 = ParseInt32(in_stack_00000028,in_stack_00000020,in_stack_00000018);
    bVar2 = uVar1 ^ 0xff;
    Message::~Message((Message *)0x23d6e8);
    if ((bVar2 & 1) == 0) {
      local_4 = local_44;
    }
    else {
      Message::Message(this);
      in_stack_ffffffffffffff60 =
           (String *)
           Message::operator<<(this_00,(int *)CONCAT17(uVar1,CONCAT16(bVar2,
                                                  in_stack_ffffffffffffff68)));
      Message::GetString((Message *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_ffffffffffffff68)));
      pcVar3 = String::c_str(&local_60);
      printf("The default value %s is used.\n",pcVar3);
      String::~String(in_stack_ffffffffffffff60);
      Message::~Message((Message *)0x23d763);
      fflush(_stdout);
      local_4 = local_14;
    }
  }
  local_40 = 1;
  String::~String(in_stack_ffffffffffffff60);
  return local_4;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
  const String env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
}